

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void duckdb_je_free(void *ptr)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  
  lVar2 = __tls_get_addr(&PTR_024e0b60);
  uVar3 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  if (*(ulong *)(lVar2 + 0x1b8 + uVar3) == ((ulong)ptr & 0xffffffffc0000000)) {
    uVar5 = *(ulong *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) +
                      *(long *)(lVar2 + uVar3 + 0x1c0));
    uVar3 = uVar5 >> 0x30;
    bVar4 = (byte)uVar5 ^ 1;
  }
  else {
    bVar4 = 1;
    uVar3 = 0;
  }
  if (((bVar4 & 1) == 0) &&
     (uVar5 = duckdb_je_sz_index2size_tab[uVar3] + *(long *)(lVar2 + 0x350),
     uVar5 < *(ulong *)(lVar2 + 0x358))) {
    lVar6 = uVar3 * 0x18;
    lVar1 = *(long *)(lVar2 + 0x368 + lVar6);
    if (*(short *)(lVar2 + 0x37a + lVar6) != (short)lVar1) {
      *(long *)(lVar6 + lVar2 + 0x368) = lVar1 + -8;
      *(void **)(lVar1 + -8) = ptr;
      *(ulong *)(lVar2 + 0x350) = uVar5;
      return;
    }
  }
  duckdb_je_free_default(ptr);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_free(void *ptr) {
	LOG("core.free.entry", "ptr: %p", ptr);

	je_free_impl(ptr);

	LOG("core.free.exit", "");
}